

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O0

vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
indk::NeuralNet::doLearn
          (vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,NeuralNet *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *Xx,bool prepare,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inputs)

{
  Interlink *this_00;
  bool bVar1;
  string local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *inputs_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *pvStack_20;
  bool prepare_local;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *Xx_local;
  NeuralNet *this_local;
  
  local_30 = inputs;
  inputs_local._7_1_ = prepare;
  pvStack_20 = Xx;
  Xx_local = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)this;
  this_local = (NeuralNet *)__return_storage_ptr__;
  if ((this->InterlinkService != (Interlink *)0x0) &&
     (bVar1 = Interlink::isInterlinked(this->InterlinkService), bVar1)) {
    this_00 = this->InterlinkService;
    getStructure_abi_cxx11_(&local_50,this,true);
    Interlink::doUpdateStructure(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this->t = 0;
  setLearned(this,false);
  if ((inputs_local._7_1_ & 1) != 0) {
    doPrepare(this);
  }
  doSignalTransfer(__return_storage_ptr__,this,pvStack_20,local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<indk::OutputValue> indk::NeuralNet::doLearn(const std::vector<std::vector<float>>& Xx, bool prepare, const std::vector<std::string>& inputs) {
    if (InterlinkService && InterlinkService->isInterlinked()) {
        InterlinkService -> doUpdateStructure(getStructure());
    }
    t = 0;
    setLearned(false);
    if (prepare) doPrepare();
    return doSignalTransfer(Xx, inputs);
}